

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

void cf_aes_encrypt(cf_aes_context *ctx,uint8_t *in,uint8_t *out)

{
  uint32_t *puVar1;
  int iVar2;
  uint32_t *puVar3;
  uint uVar4;
  uint uVar6;
  uint uVar7;
  undefined1 auVar5 [16];
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  
  uVar4 = ctx->rounds;
  if ((uVar4 < 0xf) && ((0x5400U >> (uVar4 & 0x1f) & 1) != 0)) {
    uVar6 = *(uint *)in;
    uVar7 = *(uint *)(in + 4);
    uVar8 = *(uint *)(in + 8);
    uVar9 = *(uint *)(in + 0xc);
    local_38 = (uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18) ^
               ctx->ks[0];
    uStack_34 = (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18) ^
                ctx->ks[1];
    uStack_30 = (uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18) ^
                ctx->ks[2];
    uStack_2c = (uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18) ^
                ctx->ks[3];
    iVar2 = uVar4 - 1;
    puVar1 = ctx->ks + 4;
    do {
      puVar3 = puVar1;
      sub_block(&local_38);
      shift_rows(&local_38);
      auVar5._0_4_ = local_38 >> 7;
      auVar5._4_4_ = uStack_34 >> 7;
      auVar5._8_4_ = uStack_30 >> 7;
      auVar5._12_4_ = uStack_2c >> 7;
      auVar5 = auVar5 & _DAT_00129080;
      uVar4 = auVar5._0_4_ * 0x1b ^ local_38 * 2 & 0xfefefefe;
      uVar6 = auVar5._4_4_ * 0x1b ^ uStack_34 * 2 & 0xfefefefe;
      uVar7 = (uint)((auVar5._8_8_ & 0xffffffff) * 0x1b) ^ uStack_30 * 2 & 0xfefefefe;
      uVar8 = auVar5._12_4_ * 0x1b ^ uStack_2c * 2 & 0xfefefefe;
      uVar9 = uVar4 ^ local_38;
      uVar10 = uVar6 ^ uStack_34;
      uVar11 = uVar7 ^ uStack_30;
      uVar12 = uVar8 ^ uStack_2c;
      local_38 = *puVar3 ^ (local_38 << 0x18 | local_38 >> 8) ^
                           (local_38 << 0x10 | local_38 >> 0x10) ^ uVar4 ^
                 (uVar9 << 8 | uVar9 >> 0x18);
      uStack_34 = puVar3[1] ^
                  (uStack_34 << 0x18 | uStack_34 >> 8) ^ (uStack_34 << 0x10 | uStack_34 >> 0x10) ^
                  uVar6 ^ (uVar10 << 8 | uVar10 >> 0x18);
      uStack_30 = puVar3[2] ^
                  (uStack_30 << 0x18 | uStack_30 >> 8) ^ (uStack_30 << 0x10 | uStack_30 >> 0x10) ^
                  uVar7 ^ (uVar11 << 8 | uVar11 >> 0x18);
      uStack_2c = puVar3[3] ^
                  (uStack_2c << 0x18 | uStack_2c >> 8) ^ (uStack_2c << 0x10 | uStack_2c >> 0x10) ^
                  uVar8 ^ (uVar12 << 8 | uVar12 >> 0x18);
      iVar2 = iVar2 + -1;
      puVar1 = puVar3 + 4;
    } while (iVar2 != 0);
    sub_block(&local_38);
    shift_rows(&local_38);
    local_38 = local_38 ^ puVar3[4];
    uStack_34 = uStack_34 ^ puVar3[5];
    uStack_30 = uStack_30 ^ puVar3[6];
    uStack_2c = uStack_2c ^ puVar3[7];
    *out = (uint8_t)(local_38 >> 0x18);
    out[1] = (uint8_t)(local_38 >> 0x10);
    out[2] = (uint8_t)(local_38 >> 8);
    out[3] = (uint8_t)local_38;
    out[4] = (uint8_t)(uStack_34 >> 0x18);
    out[5] = (uint8_t)(uStack_34 >> 0x10);
    out[6] = (uint8_t)(uStack_34 >> 8);
    out[7] = (uint8_t)uStack_34;
    out[8] = (uint8_t)(uStack_30 >> 0x18);
    out[9] = (uint8_t)(uStack_30 >> 0x10);
    out[10] = (uint8_t)(uStack_30 >> 8);
    out[0xb] = (uint8_t)uStack_30;
    out[0xc] = (uint8_t)(uStack_2c >> 0x18);
    out[0xd] = (uint8_t)(uStack_2c >> 0x10);
    out[0xe] = (uint8_t)(uStack_2c >> 8);
    out[0xf] = (uint8_t)uStack_2c;
    return;
  }
  abort();
}

Assistant:

void cf_aes_encrypt(const cf_aes_context *ctx,
                    const uint8_t in[AES_BLOCKSZ],
                    uint8_t out[AES_BLOCKSZ])
{
  assert(ctx->rounds == AES128_ROUNDS ||
         ctx->rounds == AES192_ROUNDS ||
         ctx->rounds == AES256_ROUNDS);

  uint32_t state[4] = {
    read32_be(in + 0),
    read32_be(in + 4),
    read32_be(in + 8),
    read32_be(in + 12)
  };

  const uint32_t *round_keys = ctx->ks;
  add_round_key(state, round_keys);
  round_keys += 4;

  uint32_t round;
  for (round = 1; round < ctx->rounds; round++)
  {
    sub_block(state);
    shift_rows(state);
    mix_columns(state);
    add_round_key(state, round_keys);
    round_keys += 4;
  }

  sub_block(state);
  shift_rows(state);
  add_round_key(state, round_keys);

  write32_be(state[0], out + 0);
  write32_be(state[1], out + 4);
  write32_be(state[2], out + 8);
  write32_be(state[3], out + 12);
}